

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  cmDeleteAll<std::__cxx11::list<cmFileLock*,std::allocator<cmFileLock*>>>(&this->Locks);
  std::__cxx11::_List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>::_M_clear
            ((_List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_> *)this);
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}